

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  char *pcVar1;
  byte *pbVar2;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  char *in_RCX;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  byte bVar11;
  long lVar12;
  pointer pcVar13;
  pointer pcVar14;
  bool bVar15;
  string_view src;
  UntypedFormatSpecImpl format;
  string_view str;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  LogMessage local_60;
  Data local_50;
  code *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (text->_M_string_length == 0) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x48a);
    str._M_str = 
    " Tokenizer::ParseStringAppend() passed text that could not have been tokenized as a string: ";
    str._M_len = 0x5c;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_60,str);
    src._M_str = in_RCX;
    src._M_len = (size_t)(text->_M_dataplus)._M_p;
    absl::lts_20250127::CEscape_abi_cxx11_
              ((string *)&local_50,(lts_20250127 *)text->_M_string_length,src);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_60,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.ptr != &local_40) {
      operator_delete(local_50.ptr,local_40._M_allocated_capacity + 1);
    }
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_60);
  }
  else {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(output->_M_dataplus)._M_p != &output->field_2) {
      uVar4 = (output->field_2)._M_allocated_capacity;
    }
    if (uVar4 < text->_M_string_length + output->_M_string_length) {
      std::__cxx11::string::reserve((ulong)output);
    }
    pcVar14 = (text->_M_dataplus)._M_p;
LAB_0023e8e9:
    cVar3 = pcVar14[1];
    if (cVar3 == '\\') {
      bVar11 = pcVar14[2];
      if (bVar11 == 0) goto LAB_0023e95b;
      pcVar13 = pcVar14 + 2;
      if ((bVar11 & 0xf8) == 0x30) {
        if ((pcVar14[3] & 0xf8U) == 0x30) {
          pcVar13 = pcVar14 + 3;
        }
        if ((pcVar13[1] & 0xf8U) == 0x30) {
          pcVar13 = pcVar13 + 1;
        }
        goto LAB_0023e974;
      }
      if (bVar11 < 0x62) {
        if (bVar11 < 0x55) {
          if (((bVar11 == 0x22) || (bVar11 == 0x27)) || (bVar11 == 0x3f)) goto LAB_0023e974;
        }
        else if (bVar11 < 0x5c) {
          if (bVar11 == 0x55) goto switchD_0023e9b7_caseD_75;
          if (bVar11 == 0x58) goto switchD_0023e9b7_caseD_78;
        }
        else if ((bVar11 == 0x5c) || (bVar11 == 0x61)) goto LAB_0023e974;
switchD_0023e9b7_caseD_6f:
        goto LAB_0023e974;
      }
      switch(bVar11) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
        goto switchD_0023e9b7_caseD_6f;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
switchD_0023e9b7_caseD_75:
        uVar6 = (uint)(bVar11 == 0x55) << 3;
        if (bVar11 == 0x75) {
          uVar6 = 4;
        }
        uVar4 = 2;
        uVar5 = 0;
        if ((uVar6 != 0) && (bVar11 = pcVar14[3], bVar11 != 0)) {
          uVar7 = (ulong)(uVar6 | 3);
          pbVar2 = (byte *)(pcVar14 + uVar7);
          pbVar10 = (byte *)(pcVar14 + 4);
          uVar5 = 0;
          do {
            uVar5 = (int)"$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$"[bVar11] + uVar5 * 0x10;
            if (pbVar2 <= pbVar10) {
              uVar4 = uVar7;
              if ((((uVar5 & 0xfffffc00) == 0xd800) && (*pbVar2 == 0x5c)) && (pbVar2[1] == 0x75)) {
                bVar11 = pbVar2[2];
                if (bVar11 == 0) {
                  uVar8 = 0;
                  bVar15 = false;
                  goto LAB_0023eb6b;
                }
                uVar8 = 0;
                uVar9 = 1;
                goto LAB_0023eb30;
              }
              break;
            }
            bVar11 = *pbVar10;
            pbVar10 = pbVar10 + 1;
          } while (bVar11 != 0);
        }
        goto LAB_0023eb92;
      case 0x76:
        break;
      case 0x78:
switchD_0023e9b7_caseD_78:
        if (((byte)(pcVar14[3] - 0x30U) < 10) ||
           ((uVar6 = (byte)pcVar14[3] - 0x41, uVar6 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) != 0)))) {
          pcVar13 = pcVar14 + 3;
        }
        if (((byte)(pcVar13[1] - 0x30U) < 10) ||
           ((uVar6 = (byte)pcVar13[1] - 0x41, uVar6 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) != 0)))) {
          pcVar13 = pcVar13 + 1;
        }
        break;
      default:
        if ((bVar11 != 0x62) && (bVar11 != 0x66)) goto switchD_0023e9b7_caseD_6f;
      }
      goto LAB_0023e974;
    }
    if (cVar3 != '\0') goto LAB_0023e95b;
  }
  return;
LAB_0023e95b:
  pcVar13 = pcVar14 + 1;
  if ((cVar3 != *(text->_M_dataplus)._M_p) ||
     (pcVar1 = pcVar14 + 2, pcVar14 = pcVar13, *pcVar1 != '\0')) {
LAB_0023e974:
    std::__cxx11::string::push_back((char)output);
    pcVar14 = pcVar13;
  }
  goto LAB_0023e8e9;
  while( true ) {
    bVar11 = pcVar14[uVar9 + (ulong)uVar6 + 5];
    uVar9 = uVar9 + 1;
    if (bVar11 == 0) break;
LAB_0023eb30:
    uVar8 = (int)"$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$$"[bVar11] + uVar8 * 0x10;
    if (uVar9 == 4) {
      uVar9 = 5;
      break;
    }
  }
  bVar15 = 4 < uVar9;
LAB_0023eb6b:
  if ((bVar15) && ((uVar8 & 0xfffffc00) == 0xdc00)) {
    uVar5 = uVar5 * 0x400 + uVar8 + 0xfca02400;
    uVar4 = uVar7 + 6;
  }
LAB_0023eb92:
  if (uVar4 == 2) {
    std::__cxx11::string::push_back((char)output);
    pcVar14 = pcVar13;
    goto LAB_0023e8e9;
  }
  local_60.errno_saver_.saved_errno_ = 0;
  if (uVar5 < 0x80) {
    lVar12 = 1;
    local_60.errno_saver_.saved_errno_ = uVar5;
  }
  else if (uVar5 < 0x800) {
    local_60.errno_saver_.saved_errno_ = (uVar5 & 0x3f) + (uVar5 & 0x7c0) * 4 + 0xc080;
    lVar12 = 2;
  }
  else if (uVar5 < 0x10000) {
    local_60.errno_saver_.saved_errno_ =
         (uVar5 & 0xf000) * 0x10 + (uVar5 & 0x3f) + (uVar5 & 0xfc0) * 4 + 0xe08080;
    lVar12 = 3;
  }
  else {
    if (0x10ffff < uVar5) {
      local_50._4_4_ = 0;
      local_50._0_4_ = uVar5;
      local_48 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
      format.size_ = 6;
      format.data_ = "\\U%08x";
      args.len_ = 1;
      args.ptr_ = (pointer)&local_50;
      absl::lts_20250127::str_format_internal::AppendPack(output,format,args);
      goto LAB_0023ec7b;
    }
    local_60.errno_saver_.saved_errno_ =
         (uVar5 & 0x3f | (uVar5 & 0x3f000) << 4 | (uVar5 & 0x1c0000) << 6) + (uVar5 & 0xfc0) * 4 +
         0xf0808080;
    lVar12 = 4;
  }
  local_60.errno_saver_.saved_errno_ = ghtonl(local_60.errno_saver_.saved_errno_);
  std::__cxx11::string::append((char *)output,(long)&local_60 + (4 - lVar12));
LAB_0023ec7b:
  pcVar14 = pcVar14 + (uVar4 - 1);
  goto LAB_0023e8e9;
}

Assistant:

void Tokenizer::ParseStringAppend(const std::string& text,
                                  std::string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    ABSL_DLOG(FATAL)
        << " Tokenizer::ParseStringAppend() passed text that could not"
           " have been tokenized as a string: "
        << absl::CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x' || *ptr == 'X') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32_t unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}